

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::internal::ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *this,Arg *arg)

{
  ulong uVar1;
  ulong *in_RDX;
  int iVar2;
  
  iVar2 = (int)arg;
  switch((uint)in_RDX[2]) {
  case 2:
  case 3:
  case 7:
    uVar1 = (ulong)(uint)*in_RDX;
    break;
  case 4:
  case 5:
    uVar1 = *in_RDX;
    break;
  case 6:
    if (iVar2 == 0x73) {
      return;
    }
    uVar1 = (ulong)((uint)*in_RDX != 0);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    return;
  default:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.h"
                  ,0x4f9,
                  "Result fmt::internal::ArgVisitor<fmt::(anonymous namespace)::ArgConverter<long>, void>::visit(const Arg &) [Impl = fmt::(anonymous namespace)::ArgConverter<long>, Result = void]"
                 );
  }
  *(uint *)(this + 0x10) = (iVar2 == 100 || iVar2 == 0x69) ^ 5;
  *(ulong *)this = uVar1;
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    default:
      FMT_ASSERT(false, "invalid argument type");
      return Result();
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
  }